

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelocDirWrapper.cpp
# Opt level: O0

void * __thiscall RelocBlockWrapper::getEntriesPtr(RelocBlockWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  void *ptr;
  offset_t entriesOffset;
  size_t entriesSize;
  void *entriesPtr;
  RelocBlockWrapper *this_local;
  
  iVar2 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0x12])(this,2,0xffffffffffffffff);
  iVar3 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0x13])(this,2,0xffffffffffffffff);
  if ((CONCAT44(extraout_var,iVar2) == 0) || (CONCAT44(extraout_var_00,iVar3) == 0)) {
    this_local = (RelocBlockWrapper *)0x0;
  }
  else {
    iVar2 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[0x14])(this,2,0xffffffffffffffff);
    pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
    iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                      (pEVar1,CONCAT44(extraout_var_01,iVar2),1,2,0);
    this_local = (RelocBlockWrapper *)CONCAT44(extraout_var_02,iVar2);
  }
  return this_local;
}

Assistant:

void* RelocBlockWrapper::getEntriesPtr()
{
    void *entriesPtr = getFieldPtr(ENTRIES_PTR);
    size_t entriesSize = getFieldSize(ENTRIES_PTR);

    if (entriesPtr == NULL || entriesSize == 0) return NULL;

    offset_t entriesOffset = getFieldOffset(ENTRIES_PTR);
    void *ptr = this->m_Exe->getContentAt(entriesOffset, Executable::RAW, sizeof(WORD));

    return ptr;
}